

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall ChainstateManager::~ChainstateManager(ChainstateManager *this)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock58;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x1870,false);
  VersionBitsCache::Clear(&this->m_versionbitscache);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  VersionBitsCache::~VersionBitsCache(&this->m_versionbitscache);
  std::
  _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
  ::~_Rb_tree(&(this->m_failed_blocks)._M_t);
  ValidationCache::~ValidationCache(&this->m_validation_cache);
  ::node::BlockManager::~BlockManager(&this->m_blockman);
  std::filesystem::__cxx11::path::~path(&(this->m_options).datadir.super_path);
  std::_Function_base::~_Function_base(&(this->snapshot_download_completed).super__Function_base);
  CCheckQueue<CScriptCheck>::~CCheckQueue(&this->m_script_check_queue);
  std::
  array<std::map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>,_29UL>
  ::~array(&this->m_warningcache);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr
            (&this->m_snapshot_chainstate);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr
            (&this->m_ibd_chainstate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ChainstateManager::~ChainstateManager()
{
    LOCK(::cs_main);

    m_versionbitscache.Clear();
}